

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void image_cb(Fl_Input *i,void *v)

{
  Fl_Widget_Type *this;
  bool bVar1;
  int iVar2;
  Fl_Type **ppFVar3;
  
  if ((char *)v == "LOAD") {
    image_input = i;
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if (iVar2 != 0) {
      iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
      if (iVar2 == 0) {
        Fl_Widget::activate((Fl_Widget *)i);
        Fl_Input_::static_value(&i->super_Fl_Input_,current_widget->image_name_);
        return;
      }
    }
    Fl_Widget::deactivate((Fl_Widget *)i);
    return;
  }
  bVar1 = false;
  ppFVar3 = &Fl_Type::first;
  while (this = (Fl_Widget_Type *)*ppFVar3, this != (Fl_Widget_Type *)0x0) {
    if ((this->super_Fl_Type).selected != '\0') {
      iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
      if (iVar2 != 0) {
        Fl_Widget_Type::image_name(this,(i->super_Fl_Input_).value_);
        bVar1 = true;
      }
    }
    ppFVar3 = &(this->super_Fl_Type).next;
  }
  if (bVar1) {
    set_modflag(1);
    return;
  }
  return;
}

Assistant:

void image_cb(Fl_Input* i, void *v) {
  if (v == LOAD) {
    image_input = i;
    if (current_widget->is_widget() && !current_widget->is_window()) {
      i->activate();
      i->static_value(((Fl_Widget_Type*)current_widget)->image_name());
    } else i->deactivate();
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        ((Fl_Widget_Type*)o)->image_name(i->value());
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}